

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

bool __thiscall glslang::HlslParseContext::hasStructBuffCounter(HlslParseContext *this,TType *type)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*type->_vptr_TType[0xb])(type);
  return (*(uint *)(CONCAT44(extraout_var,iVar1) + 8) & 0x1fe0000) == 0x960000;
}

Assistant:

bool HlslParseContext::hasStructBuffCounter(const TType& type) const
{
    switch (type.getQualifier().declaredBuiltIn) {
    case EbvAppendConsume:       // fall through...
    case EbvRWStructuredBuffer:  // ...
        return true;
    default:
        return false; // the other structuredbuffer types do not have a counter.
    }
}